

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_redo(nk_text_edit *state)

{
  undefined4 uVar1;
  undefined4 pos;
  undefined2 uVar2;
  undefined2 uVar3;
  nk_rune nVar4;
  nk_text_undo_record *pnVar5;
  nk_text_undo_record *pnVar6;
  int local_30;
  int iStack_2c;
  int i;
  nk_text_undo_record r;
  nk_text_undo_record *u;
  nk_text_undo_state *s;
  nk_text_edit *state_local;
  
  if ((state->undo).redo_point != 99) {
    pnVar5 = (state->undo).undo_rec + (state->undo).undo_point;
    pnVar6 = (state->undo).undo_rec + (state->undo).redo_point;
    pos = pnVar6->where;
    uVar2 = pnVar6->insert_length;
    uVar3 = pnVar6->delete_length;
    uVar1 = *(undefined4 *)&pnVar6->char_storage;
    pnVar5->delete_length = uVar2;
    pnVar5->insert_length = uVar3;
    pnVar5->where = pos;
    pnVar5->char_storage = -1;
    if (uVar3 != 0) {
      if ((int)(state->undo).redo_char_point <
          (int)(state->undo).undo_char_point + (int)pnVar5->insert_length) {
        pnVar5->insert_length = 0;
        pnVar5->delete_length = 0;
      }
      else {
        pnVar5->char_storage = (state->undo).undo_char_point;
        (state->undo).undo_char_point = (state->undo).undo_char_point + pnVar5->insert_length;
        for (local_30 = 0; local_30 < pnVar5->insert_length; local_30 = local_30 + 1) {
          nVar4 = nk_str_rune_at(&state->string,pnVar5->where + local_30);
          (state->undo).undo_char[pnVar5->char_storage + local_30] = nVar4;
        }
      }
      nk_str_delete_runes(&state->string,pos,(int)(short)uVar3);
    }
    if (uVar2 != 0) {
      r.where._0_2_ = (short)uVar1;
      nk_str_insert_text_runes
                (&state->string,pos,(state->undo).undo_char + (short)r.where,(int)(short)uVar2);
    }
    state->cursor = pos + (int)(short)uVar2;
    (state->undo).undo_point = (state->undo).undo_point + 1;
    (state->undo).redo_point = (state->undo).redo_point + 1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_redo(struct nk_text_edit *state)
{
    struct nk_text_undo_state *s = &state->undo;
    struct nk_text_undo_record *u, r;
    if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
        return;

    /* we need to do two things: apply the redo record, and create an undo record */
    u = &s->undo_rec[s->undo_point];
    r = s->undo_rec[s->redo_point];

    /* we KNOW there must be room for the undo record, because the redo record
    was derived from an undo record */
    u->delete_length = r.insert_length;
    u->insert_length = r.delete_length;
    u->where = r.where;
    u->char_storage = -1;

    if (r.delete_length) {
        /* the redo record requires us to delete characters, so the undo record
        needs to store the characters */
        if (s->undo_char_point + u->insert_length > s->redo_char_point) {
            u->insert_length = 0;
            u->delete_length = 0;
        } else {
            int i;
            u->char_storage = s->undo_char_point;
            s->undo_char_point = (short)(s->undo_char_point + u->insert_length);

            /* now save the characters */
            for (i=0; i < u->insert_length; ++i) {
                s->undo_char[u->char_storage + i] =
                    nk_str_rune_at(&state->string, u->where + i);
            }
        }
        nk_str_delete_runes(&state->string, r.where, r.delete_length);
    }

    if (r.insert_length) {
        /* easy case: need to insert n characters */
        nk_str_insert_text_runes(&state->string, r.where,
            &s->undo_char[r.char_storage], r.insert_length);
    }
    state->cursor = r.where + r.insert_length;

    s->undo_point++;
    s->redo_point++;
}